

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_save_riff(HTS_Engine *engine,FILE *fp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  HTS_GStreamSet *gss_00;
  size_t sVar4;
  FILE *pFVar5;
  long *in_RDI;
  int data_41_44;
  char data_37_40 [4];
  short data_35_36;
  short data_33_34;
  int data_29_32;
  int data_25_28;
  short data_23_24;
  short data_21_22;
  int data_17_20;
  char data_13_16 [4];
  char data_09_12 [4];
  int data_05_08;
  char data_01_04 [4];
  HTS_GStreamSet *gss;
  short temp;
  double x;
  size_t i;
  FILE *in_stack_ffffffffffffff98;
  FILE *fp_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  FILE *local_18;
  
  gss_00 = (HTS_GStreamSet *)(in_RDI + 0x30);
  HTS_GStreamSet_get_total_nsamples(gss_00);
  uVar1 = (undefined4)*in_RDI;
  uVar2 = (undefined4)(*in_RDI << 1);
  uVar8 = 2;
  uVar7 = 0x10;
  uVar6 = 0x61746164;
  sVar4 = HTS_GStreamSet_get_total_nsamples(gss_00);
  uVar3 = (undefined4)(sVar4 << 1);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  HTS_fwrite_little_endian
            ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
             CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  local_18 = (FILE *)0x0;
  while (fp_00 = local_18, pFVar5 = (FILE *)HTS_GStreamSet_get_total_nsamples(gss_00),
        fp_00 < pFVar5) {
    HTS_GStreamSet_get_speech(gss_00,(size_t)local_18);
    HTS_fwrite_little_endian
              ((void *)CONCAT44(uVar1,uVar2),CONCAT26(uVar8,CONCAT24(uVar7,uVar6)),
               CONCAT44(uVar3,in_stack_ffffffffffffffa0),fp_00);
    local_18 = (FILE *)((long)&local_18->_flags + 1);
  }
  return;
}

Assistant:

void HTS_Engine_save_riff(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;

   HTS_GStreamSet *gss = &engine->gss;
   char data_01_04[] = { 'R', 'I', 'F', 'F' };
   int data_05_08 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short) + 36;
   char data_09_12[] = { 'W', 'A', 'V', 'E' };
   char data_13_16[] = { 'f', 'm', 't', ' ' };
   int data_17_20 = 16;
   short data_21_22 = 1;        /* PCM */
   short data_23_24 = 1;        /* monoral */
   int data_25_28 = engine->condition.sampling_frequency;
   int data_29_32 = engine->condition.sampling_frequency * sizeof(short);
   short data_33_34 = sizeof(short);
   short data_35_36 = (short) (sizeof(short) * 8);
   char data_37_40[] = { 'd', 'a', 't', 'a' };
   int data_41_44 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short);

   /* write header */
   HTS_fwrite_little_endian(data_01_04, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_05_08, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(data_09_12, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(data_13_16, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_17_20, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_21_22, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_23_24, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_25_28, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_29_32, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_33_34, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_35_36, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(data_37_40, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_41_44, sizeof(int), 1, fp);
   /* write data */
   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      HTS_fwrite_little_endian(&temp, sizeof(short), 1, fp);
   }
}